

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::selectAllInEditor(QAbstractItemViewPrivate *this,QWidget *editor)

{
  QWidget *this_00;
  QLineEdit *this_01;
  QAbstractSpinBox *this_02;
  
  do {
    this_00 = editor;
    editor = QWidget::focusProxy(this_00);
  } while (editor != (QWidget *)0x0);
  this_01 = QtPrivate::qobject_cast_helper<QLineEdit*,QObject>(&this_00->super_QObject);
  if (this_01 != (QLineEdit *)0x0) {
    QLineEdit::selectAll(this_01);
  }
  this_02 = (QAbstractSpinBox *)
            QtPrivate::qobject_cast_helper<QSpinBox*,QObject>(&this_00->super_QObject);
  if (this_02 == (QAbstractSpinBox *)0x0) {
    this_02 = (QAbstractSpinBox *)
              QtPrivate::qobject_cast_helper<QDoubleSpinBox*,QObject>(&this_00->super_QObject);
    if (this_02 == (QAbstractSpinBox *)0x0) {
      return;
    }
  }
  QAbstractSpinBox::selectAll(this_02);
  return;
}

Assistant:

void QAbstractItemViewPrivate::selectAllInEditor(QWidget *editor)
{
    while (QWidget *fp = editor->focusProxy())
        editor = fp;

#if QT_CONFIG(lineedit)
    if (QLineEdit *le = qobject_cast<QLineEdit*>(editor))
        le->selectAll();
#endif
#if QT_CONFIG(spinbox)
    if (QSpinBox *sb = qobject_cast<QSpinBox*>(editor))
        sb->selectAll();
    else if (QDoubleSpinBox *dsb = qobject_cast<QDoubleSpinBox*>(editor))
        dsb->selectAll();
#endif
}